

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O3

int stbi_write_jpg(char *filename,int x,int y,int comp,void *data,int quality)

{
  int iVar1;
  FILE *__stream;
  stbi__write_context s;
  stbi__write_context local_40;
  
  __stream = fopen(filename,"wb");
  local_40.func = stbi__stdio_write;
  if (__stream == (FILE *)0x0) {
    iVar1 = 0;
  }
  else {
    local_40.context = __stream;
    iVar1 = stbi_write_jpg_core(&local_40,x,y,comp,data,quality);
    fclose(__stream);
  }
  return iVar1;
}

Assistant:

STBIWDEF int stbi_write_jpg(char const *filename, int x, int y, int comp,
                            const void *data, int quality) {
  stbi__write_context s;
  if (stbi__start_write_file(&s, filename)) {
    int r = stbi_write_jpg_core(&s, x, y, comp, data, quality);
    stbi__end_write_file(&s);
    return r;
  } else
    return 0;
}